

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceEntryPoint
          (DescriptorScalarReplacement *this,Instruction *var,Instruction *use)

{
  initializer_list<unsigned_int> init_list;
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint *puVar4;
  IRContext *pIVar5;
  uint32_t local_ec;
  iterator local_e8;
  undefined8 local_e0;
  SmallVector<unsigned_int,_2UL> local_d8;
  Operand local_b0;
  uint local_80;
  uint local_7c;
  uint32_t i;
  uint32_t num_replacement_vars;
  string local_70;
  Operand *local_50;
  Operand *op;
  uint32_t idx;
  bool found;
  OperandList new_operands;
  Instruction *use_local;
  Instruction *var_local;
  DescriptorScalarReplacement *this_local;
  
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)use;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&idx);
  op._7_1_ = 0;
  op._0_4_ = 0;
  do {
    uVar1 = (uint)op;
    uVar2 = opt::Instruction::NumOperands
                      ((Instruction *)
                       new_operands.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (uVar2 <= uVar1) {
      if ((op._7_1_ & 1) == 0) {
        pIVar5 = Pass::context(&this->super_Pass);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Variable cannot be replaced: invalid instruction",
                   (allocator<char> *)((long)&num_replacement_vars + 3));
        IRContext::EmitErrorMessage
                  (pIVar5,&local_70,
                   (Instruction *)
                   new_operands.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator((allocator<char> *)((long)&num_replacement_vars + 3));
        this_local._7_1_ = false;
      }
      else {
        pIVar5 = Pass::context(&this->super_Pass);
        local_7c = descsroautil::GetNumberOfElementsForArrayOrStruct(pIVar5,var);
        for (local_80 = 0; local_80 < local_7c; local_80 = local_80 + 1) {
          local_ec = GetReplacementVariable(this,var,local_80);
          local_e8 = &local_ec;
          local_e0 = 1;
          init_list._M_len = 1;
          init_list._M_array = local_e8;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d8,init_list);
          Operand::Operand(&local_b0,SPV_OPERAND_TYPE_ID,&local_d8);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&idx
                     ,&local_b0);
          Operand::~Operand(&local_b0);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d8);
        }
        opt::Instruction::ReplaceOperands
                  ((Instruction *)
                   new_operands.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(OperandList *)&idx);
        pIVar5 = Pass::context(&this->super_Pass);
        IRContext::UpdateDefUse
                  (pIVar5,(Instruction *)
                          new_operands.
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_local._7_1_ = true;
      }
      i = 1;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&idx);
      return this_local._7_1_;
    }
    local_50 = opt::Instruction::GetOperand
                         ((Instruction *)
                          new_operands.
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint)op);
    if (local_50->type == SPV_OPERAND_TYPE_ID) {
      puVar4 = utils::SmallVector<unsigned_int,_2UL>::operator[](&local_50->words,0);
      uVar2 = *puVar4;
      uVar3 = opt::Instruction::result_id(var);
      if (uVar2 != uVar3) goto LAB_0099c7d1;
      op._7_1_ = 1;
    }
    else {
LAB_0099c7d1:
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&idx,
                 local_50);
    }
    op._0_4_ = (uint)op + 1;
  } while( true );
}

Assistant:

bool DescriptorScalarReplacement::ReplaceEntryPoint(Instruction* var,
                                                    Instruction* use) {
  // Build a new |OperandList| for |use| that removes |var| and adds its
  // replacement variables.
  Instruction::OperandList new_operands;

  // Copy all operands except |var|.
  bool found = false;
  for (uint32_t idx = 0; idx < use->NumOperands(); idx++) {
    Operand& op = use->GetOperand(idx);
    if (op.type == SPV_OPERAND_TYPE_ID && op.words[0] == var->result_id()) {
      found = true;
    } else {
      new_operands.emplace_back(op);
    }
  }

  if (!found) {
    context()->EmitErrorMessage(
        "Variable cannot be replaced: invalid instruction", use);
    return false;
  }

  // Add all new replacement variables.
  uint32_t num_replacement_vars =
      descsroautil::GetNumberOfElementsForArrayOrStruct(context(), var);
  for (uint32_t i = 0; i < num_replacement_vars; i++) {
    new_operands.push_back(
        {SPV_OPERAND_TYPE_ID, {GetReplacementVariable(var, i)}});
  }

  use->ReplaceOperands(new_operands);
  context()->UpdateDefUse(use);
  return true;
}